

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

_Bool bitset_resize(bitset_t *bitset,size_t newarraysize,_Bool padwithzeroes)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  byte in_DL;
  ulong in_RSI;
  long *in_RDI;
  size_t newcapacity;
  uint64_t *newarray;
  size_t smallest;
  ulong local_40;
  _Bool local_1;
  
  if (in_RSI < 0x400000000000000) {
    local_40 = in_RSI;
    if ((ulong)in_RDI[1] <= in_RSI) {
      local_40 = in_RDI[1];
    }
    if ((ulong)in_RDI[2] < in_RSI) {
      iVar1 = cbitset_leading_zeroes(in_RSI);
      lVar2 = (0xffffffffffffffffU >> ((byte)iVar1 & 0x3f)) + 1;
      pvVar3 = realloc((void *)*in_RDI,lVar2 * 8);
      if (pvVar3 == (void *)0x0) {
        return false;
      }
      in_RDI[2] = lVar2;
      *in_RDI = (long)pvVar3;
    }
    if (((in_DL & 1) != 0) && (local_40 < in_RSI)) {
      memset((void *)(*in_RDI + local_40 * 8),0,(in_RSI - local_40) * 8);
    }
    in_RDI[1] = in_RSI;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool bitset_resize(bitset_t *bitset,  size_t newarraysize, bool padwithzeroes) {
  if(newarraysize > SIZE_MAX/64) { return false; }
  size_t smallest = newarraysize < bitset->arraysize ? newarraysize : bitset->arraysize;
  if (bitset->capacity < newarraysize) {
    uint64_t *newarray;
    size_t newcapacity = (UINT64_C(0xFFFFFFFFFFFFFFFF) >> cbitset_leading_zeroes(newarraysize)) + 1;
    if ((newarray = (uint64_t *) realloc(bitset->array, sizeof(uint64_t) * newcapacity)) == NULL) {
      return false;
    }
    bitset->capacity = newcapacity;
    bitset->array = newarray;
  }
  if (padwithzeroes && (newarraysize > smallest)) {
    memset(bitset->array + smallest,0,sizeof(uint64_t) * (newarraysize - smallest));
  }
  bitset->arraysize = newarraysize;
  return true; // success!
}